

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void SparseKeygenRecurse<Blob<3072>,Blob<128>>
               (pfHash hash,int start,int bitsleft,bool inclusive,Blob<3072> *k,
               vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  uint32_t start_00;
  Blob<128> h;
  value_type local_48;
  
  local_48.bytes[0] = '\0';
  local_48.bytes[1] = '\0';
  local_48.bytes[2] = '\0';
  local_48.bytes[3] = '\0';
  local_48.bytes[4] = '\0';
  local_48.bytes[5] = '\0';
  local_48.bytes[6] = '\0';
  local_48.bytes[7] = '\0';
  local_48.bytes[8] = '\0';
  local_48.bytes[9] = '\0';
  local_48.bytes[10] = '\0';
  local_48.bytes[0xb] = '\0';
  local_48.bytes[0xc] = '\0';
  local_48.bytes[0xd] = '\0';
  local_48.bytes[0xe] = '\0';
  local_48.bytes[0xf] = '\0';
  if (start < 0xc00) {
    do {
      flipbit(k,0x180,start);
      if (bitsleft == 1 || inclusive) {
        (*hash)(k,0x180,0,&local_48);
        std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      }
      start_00 = start + 1;
      if (1 < bitsleft) {
        SparseKeygenRecurse<Blob<3072>,Blob<128>>(hash,start_00,bitsleft + -1,inclusive,k,hashes);
      }
      flipbit(k,0x180,start);
      start = start_00;
    } while (start_00 != 0xc00);
  }
  return;
}

Assistant:

void SparseKeygenRecurse ( pfHash hash, int start, int bitsleft, bool inclusive, keytype & k, std::vector<hashtype> & hashes )
{
  const int nbytes = sizeof(keytype);
  const int nbits = nbytes * 8;

  hashtype h;

  for(int i = start; i < nbits; i++)
  {
    flipbit(&k, nbytes, i);

    if(inclusive || (bitsleft == 1))
    {
      hash(&k, sizeof(keytype), 0, &h);
      hashes.push_back(h);
    }

    if(bitsleft > 1)
    {
      SparseKeygenRecurse(hash, i+1, bitsleft-1, inclusive, k, hashes);
    }

    flipbit(&k, nbytes, i);
  }
}